

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_simple(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  loc_conflict lVar8;
  loc lVar9;
  square *psVar10;
  int iVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  wchar_t x2;
  uint32_t uVar17;
  wchar_t y1;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t x1;
  wchar_t y1_00;
  loc_conflict centre_local;
  
  centre_local = centre;
  uVar2 = Rand_div(4);
  uVar3 = Rand_div(3);
  uVar4 = Rand_div(0xb);
  uVar5 = Rand_div(0xb);
  wVar13 = uVar3 + uVar2 + L'\x05';
  wVar19 = uVar5 + 5 + uVar4;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar13,wVar19);
  if ((c->height <= centre.y) || (wVar12 = centre.y, c->width <= centre.x)) {
    _Var1 = find_space(&centre_local,wVar13,wVar19);
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    wVar12 = centre_local.y;
  }
  iVar11 = uVar2 + uVar3 + 3;
  iVar16 = uVar5 + 3 + uVar4;
  iVar14 = iVar11 / -2;
  y1 = wVar12 + iVar14;
  x1 = centre.x + iVar16 / -2;
  wVar13 = iVar11 + y1;
  wVar19 = uVar2 + uVar3 + 2 + y1;
  x2 = x1 + iVar16;
  wVar6 = iVar16 + -1 + x1;
  wVar18 = c->depth;
  uVar7 = Rand_div(0x19);
  y1_00 = wVar12 + L'\xffffffff' + iVar14;
  wVar12 = centre.x + -1 + iVar16 / -2;
  generate_room(c,y1_00,wVar12,wVar13,x2,(uint)(wVar18 <= uVar7 + L'\x01'));
  draw_rectangle(c,y1_00,wVar12,wVar13,x2,FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,y1,x1,wVar19,wVar6,FEAT_FLOOR,L'\0');
  uVar7 = Rand_div(0x14);
  if (uVar7 == 0) {
    uVar15 = wVar6 - x1;
    uVar2 = 0;
    uVar3 = 0;
    if ((uVar15 & 1) != 0) {
      uVar3 = Rand_div(2);
    }
    if ((wVar19 - y1 & 1U) != 0) {
      uVar2 = Rand_div(2);
    }
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillared");
    for (wVar18 = y1 + uVar2; wVar6 = x1 + uVar3, wVar18 < wVar13; wVar18 = wVar18 + L'\x02') {
      for (; wVar6 < x2; wVar6 = wVar6 + L'\x02') {
        lVar8 = loc(wVar6,wVar18);
        set_marked_granite(c,lVar8,L'\v');
      }
    }
    if (uVar2 == 0) {
      if (uVar3 == 0) {
        lVar9 = (loc)loc(wVar12,y1_00);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(wVar12,y1_00);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
      if ((uVar15 - uVar3 & 1) == 0) {
        lVar9 = (loc)loc(x2,y1_00);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,4);
        lVar9 = (loc)loc(x2,y1_00);
        psVar10 = square((chunk_conflict *)c,lVar9);
        flag_off(psVar10->info,3,0xc);
      }
    }
    if (((wVar19 - y1) - uVar2 & 1U) != 0) {
      return true;
    }
    if (uVar3 == 0) {
      lVar9 = (loc)loc(wVar12,wVar13);
      psVar10 = square((chunk_conflict *)c,lVar9);
      flag_off(psVar10->info,3,4);
      lVar9 = (loc)loc(wVar12,wVar13);
      psVar10 = square((chunk_conflict *)c,lVar9);
      flag_off(psVar10->info,3,0xc);
    }
    if ((uVar15 - uVar3 & 1) != 0) {
      return true;
    }
    lVar9 = (loc)loc(x2,wVar13);
    psVar10 = square((chunk_conflict *)c,lVar9);
    flag_off(psVar10->info,3,4);
    lVar9 = (loc)loc(x2,wVar13);
    psVar10 = square((chunk_conflict *)c,lVar9);
    flag_off(psVar10->info,3,0xc);
  }
  else {
    uVar7 = Rand_div(0x32);
    if (uVar7 != 0) {
      return true;
    }
    uVar17 = 0;
    uVar7 = 0;
    if ((wVar6 - x1 & 1U) != 0) {
      uVar7 = Rand_div(2);
    }
    if ((wVar19 - y1 & 1U) != 0) {
      uVar17 = Rand_div(2);
    }
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"ragged");
    iVar14 = uVar17 + y1;
    while (iVar14 = iVar14 + 2, iVar14 <= uVar3 + uVar2 + y1) {
      lVar8 = loc(x1,iVar14);
      set_marked_granite(c,lVar8,L'\v');
      lVar8 = loc(wVar6,iVar14);
      set_marked_granite(c,lVar8,L'\v');
    }
    iVar14 = x1 + uVar7;
    while (iVar14 = iVar14 + 2, iVar14 <= uVar5 + uVar4 + x1) {
      lVar8 = loc(iVar14,y1);
      set_marked_granite(c,lVar8,L'\v');
      lVar8 = loc(iVar14,wVar19);
      set_marked_granite(c,lVar8,L'\v');
    }
  }
  return true;
}

Assistant:

bool build_simple(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int light = false;

	/* Pick a room size */
	int height = 1 + randint1(4) + randint1(3);
	int width = 1 + randint1(11) + randint1(11);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Set bounds */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Generate new room */
	generate_room(c, y1-1, x1-1, y2+1, x2+1, light);

	/* Generate outer walls and inner floors */
	draw_rectangle(c, y1-1, x1-1, y2+1, x2+1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	if (one_in_(20)) {
		/*
		 * Sometimes make a pillar room.
		 * If a dimension is even, don't always put a pillar in the
		 * upper left corner.
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillared");

		for (y = y1 + offy; y <= y2; y += 2)
			for (x = x1 + offx; x <= x2; x += 2)
				set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);
		/*
		 * Drop room/outer wall flags on corners if not adjacent to a
		 * floor.  Lets tunnels enter those grids.
		 */
		if (!offy) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y1 - 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
		if ((y2 - y1 - offy) % 2 == 0) {
			if (!offx) {
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x1 - 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
			if ((x2 - x1 - offx) % 2 == 0) {
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_ROOM);
				sqinfo_off(square(c, loc(x2 + 1, y2 + 1))->info,
					SQUARE_WALL_OUTER);
			}
		}
	} else if (one_in_(50)) {
		/*
		 * Sometimes make a ragged-edge room.
		 * If a dimension is even, don't always put the first
		 * indentations at (x1, y1 + 2) and (x1 + 2, y1).
		 */
		int offx = ((x2 - x1) % 2 == 0) ? 0 : randint0(2);
		int offy = ((y2 - y1) % 2 == 0) ? 0 : randint0(2);

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "ragged");

		for (y = y1 + 2 + offy; y <= y2 - 2; y += 2) {
			set_marked_granite(c, loc(x1, y), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x2, y), SQUARE_WALL_INNER);
		}

		for (x = x1 + 2 + offx; x <= x2 - 2; x += 2) {
			set_marked_granite(c, loc(x, y1), SQUARE_WALL_INNER);
			set_marked_granite(c, loc(x, y2), SQUARE_WALL_INNER);
		}
	}
	return true;
}